

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_isBaseUnitSecondRedefinedPrinted_Test::Units_isBaseUnitSecondRedefinedPrinted_Test
          (Units_isBaseUnitSecondRedefinedPrinted_Test *this)

{
  Units_isBaseUnitSecondRedefinedPrinted_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Units_isBaseUnitSecondRedefinedPrinted_Test_001b5090;
  return;
}

Assistant:

TEST(Units, isBaseUnitSecondRedefinedPrinted)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model\">\n"
        "  <units name=\"second\">\n"
        "    <unit units=\"volt\"/>\n"
        "  </units>\n"
        "</model>\n";

    libcellml::PrinterPtr p = libcellml::Printer::create();
    libcellml::ModelPtr m = libcellml::Model::create("model");
    libcellml::UnitsPtr u = libcellml::Units::create();

    u->setName("second");
    u->addUnit("volt");

    m->addUnits(u);

    EXPECT_FALSE(u->isBaseUnit());

    EXPECT_EQ(e, p->printModel(m));
}